

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int parse_device(dev_t *pdev,archive *a,char *val)

{
  int iVar1;
  char *pcVar2;
  pack_t *ppVar3;
  size_t sVar4;
  u_long uVar5;
  dev_t dVar6;
  ulong uVar7;
  char *pcVar8;
  char *error;
  unsigned_long numbers [3];
  char *local_60;
  char *local_58;
  char *local_50;
  u_long local_48 [3];
  
  local_60 = (char *)0x0;
  *pdev = 0;
  local_50 = val;
  pcVar2 = strchr(val,0x2c);
  if (pcVar2 == (char *)0x0) {
    dVar6 = mtree_atol(&local_50);
LAB_0020c1e2:
    *pdev = dVar6;
    iVar1 = 0;
  }
  else {
    *pcVar2 = '\0';
    ppVar3 = pack_find(val);
    if (ppVar3 == (pack_t *)0x0) {
      pcVar2 = "Unknown format `%s\'";
LAB_0020c1fb:
      archive_set_error(a,0x54,pcVar2,val);
    }
    else {
      uVar7 = 0;
      pcVar2 = pcVar2 + 1;
      do {
        if (*pcVar2 == '\0') {
          if (uVar7 < 2) {
            pcVar2 = "Not enough arguments";
            goto LAB_0020c21a;
          }
          dVar6 = (*ppVar3)((int)uVar7,local_48,&local_60);
          if (local_60 == (char *)0x0) goto LAB_0020c1e2;
          pcVar2 = "%s";
          val = local_60;
          goto LAB_0020c1fb;
        }
        sVar4 = strcspn(pcVar2,",");
        pcVar8 = pcVar2 + sVar4;
        if (pcVar2[sVar4] != '\0') {
          *pcVar8 = '\0';
          pcVar8 = pcVar8 + 1;
        }
        local_58 = pcVar2;
        if (*pcVar2 == '\0') {
          pcVar2 = "Missing number";
          goto LAB_0020c21a;
        }
        uVar5 = mtree_atol(&local_58);
        local_48[uVar7] = uVar5;
        uVar7 = uVar7 + 1;
        pcVar2 = pcVar8;
      } while (uVar7 != 4);
      pcVar2 = "Too many arguments";
LAB_0020c21a:
      archive_set_error(a,0x54,pcVar2);
    }
    iVar1 = -0x14;
  }
  return iVar1;
}

Assistant:

static int
parse_device(dev_t *pdev, struct archive *a, char *val)
{
#define MAX_PACK_ARGS 3
	unsigned long numbers[MAX_PACK_ARGS];
	char *p, *dev;
	int argc;
	pack_t *pack;
	dev_t result;
	const char *error = NULL;

	memset(pdev, 0, sizeof(*pdev));
	if ((dev = strchr(val, ',')) != NULL) {
		/*
		 * Device's major/minor are given in a specified format.
		 * Decode and pack it accordingly.
		 */
		*dev++ = '\0';
		if ((pack = pack_find(val)) == NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown format `%s'", val);
			return ARCHIVE_WARN;
		}
		argc = 0;
		while ((p = la_strsep(&dev, ",")) != NULL) {
			if (*p == '\0') {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing number");
				return ARCHIVE_WARN;
			}
			numbers[argc++] = mtree_atol(&p);
			if (argc > MAX_PACK_ARGS) {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Too many arguments");
				return ARCHIVE_WARN;
			}
		}
		if (argc < 2) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Not enough arguments");
			return ARCHIVE_WARN;
		}
		result = (*pack)(argc, numbers, &error);
		if (error != NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "%s", error);
			return ARCHIVE_WARN;
		}
	} else {
		/* file system raw value. */
		result = (dev_t)mtree_atol(&val);
	}
	*pdev = result;
	return ARCHIVE_OK;
#undef MAX_PACK_ARGS
}